

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vocabulary.h
# Opt level: O2

void __thiscall NotFoundException::~NotFoundException(NotFoundException *this)

{
  *(undefined ***)this = &PTR__NotFoundException_00147d28;
  std::__cxx11::string::~string((string *)&this->error_message);
  std::exception::~exception(&this->super_exception);
  return;
}

Assistant:

NotFoundException(string name) {
        this->error_message = name + " is not found";
    }